

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

void write_handler_third_fragment(cio_websocket *websocket,void *context,cio_error err)

{
  cio_write_buffer *payload;
  _Bool _Var1;
  cio_error cVar2;
  
  write_handler_fake.custom_fake = (_func_void_cio_websocket_ptr_void_ptr_cio_error *)0x0;
  _Var1 = check_frame(CIO_WEBSOCKET_CONTINUATION_FRAME,(char *)((long)context + 0x405),5,false);
  if (_Var1) {
    payload = (cio_write_buffer *)((long)context + 0x3c0);
    *(long *)((long)context + 0x3f0) = (long)context + 0x40a;
    *(undefined8 *)((long)context + 0x3f8) = 5;
    *(cio_write_buffer **)((long)context + 0x3e0) = payload;
    *(cio_write_buffer **)((long)context + 1000) = payload;
    *(long *)((long)context + 0x3c0) = (long)context + 0x3e0;
    *(long *)((long)context + 0x3c8) = (long)context + 0x3e0;
    *(undefined8 *)((long)context + 0x3d0) = 1;
    *(undefined8 *)((long)context + 0x3d8) = 5;
    cVar2 = cio_websocket_write_message_first_chunk
                      (websocket,5,payload,true,false,write_handler,context);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Writing third frame of text message did not succeed!",0xa7d,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Second fragment written not correct",0xa76);
}

Assistant:

static void write_handler_third_fragment(struct cio_websocket *websocket, void *context, enum cio_error err)
{
	write_handler_fake.custom_fake = NULL;

	struct fragmented_websocket *fws = (struct fragmented_websocket *)context;

	TEST_ASSERT_TRUE_MESSAGE(check_frame(CIO_WEBSOCKET_CONTINUATION_FRAME, fws->second_fragment, sizeof(fws->second_fragment), false), "Second fragment written not correct");

	cio_write_buffer_head_init(&fws->wbh);
	cio_write_buffer_element_init(&fws->wb, fws->third_fragment, sizeof(fws->third_fragment));
	cio_write_buffer_queue_tail(&fws->wbh, &fws->wb);

	err = cio_websocket_write_message_first_chunk(websocket, cio_write_buffer_get_total_size(&fws->wbh), &fws->wbh, true, false, write_handler, fws);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing third frame of text message did not succeed!");
}